

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

void device_fini(void *arg)

{
  ulong uVar1;
  nni_aio *pnVar2;
  long lVar3;
  
  pnVar2 = (nni_aio *)((long)arg + 0x38);
  for (lVar3 = 0; uVar1 = (ulong)*(int *)((long)arg + 8), lVar3 < (long)uVar1; lVar3 = lVar3 + 1) {
    nni_aio_stop(pnVar2);
    pnVar2 = (nni_aio *)&pnVar2[1].a_task;
  }
  pnVar2 = (nni_aio *)((long)arg + 0x38);
  for (lVar3 = 0; lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
    nni_aio_fini(pnVar2);
    uVar1 = (ulong)*(uint *)((long)arg + 8);
    pnVar2 = (nni_aio *)&pnVar2[1].a_task;
  }
  nni_sock_rele(*(nni_sock **)((long)arg + 0x28));
  nni_sock_rele(*(nni_sock **)((long)arg + 0x30));
  nni_free(arg,0x3f0);
  return;
}

Assistant:

static void
device_fini(void *arg)
{
	device_data *d = arg;

	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_stop(&d->paths[i].aio);
	}
	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_fini(&d->paths[i].aio);
	}
	nni_sock_rele(d->paths[0].src);
	nni_sock_rele(d->paths[0].dst);
	NNI_FREE_STRUCT(d);
}